

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

Vec_Wec_t * Gia_ManComputeMffcs(Gia_Man_t *p,int LimitMin,int LimitMax,int SuppMax,int RatioBest)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vLeaves_00;
  Vec_Int_t *vInners_00;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  bool bVar4;
  int local_54;
  int iPivot;
  int i;
  Vec_Int_t *vMffc;
  Vec_Int_t *vInners;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vNodes;
  Vec_Wec_t *vMffcs;
  Gia_Obj_t *pObj;
  int RatioBest_local;
  int SuppMax_local;
  int LimitMax_local;
  int LimitMin_local;
  Gia_Man_t *p_local;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaResub.c"
                  ,0x67,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
  }
  pVVar3 = Vec_IntAlloc(LimitMax << 1);
  vLeaves_00 = Vec_IntAlloc(LimitMax << 1);
  vInners_00 = Vec_IntAlloc(LimitMax << 1);
  p_00 = Vec_WecAlloc(1000);
  Gia_ManCreateRefs(p);
  local_54 = 0;
  while( true ) {
    bVar4 = false;
    if (local_54 < p->nObjs) {
      vMffcs = (Vec_Wec_t *)Gia_ManObj(p,local_54);
      bVar4 = vMffcs != (Vec_Wec_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vMffcs);
    if ((((iVar1 != 0) && (iVar1 = Gia_ObjRefNum(p,(Gia_Obj_t *)vMffcs), iVar1 != 0)) &&
        (iVar1 = Gia_ObjCheckMffc(p,(Gia_Obj_t *)vMffcs,LimitMax,pVVar3,vLeaves_00,vInners_00),
        iVar1 != 0)) &&
       ((iVar1 = Vec_IntSize(vInners_00), LimitMin <= iVar1 &&
        (iVar1 = Vec_IntSize(vLeaves_00), iVar1 <= SuppMax)))) {
      p_01 = Vec_WecPushLevel(p_00);
      iVar1 = Vec_IntSize(vLeaves_00);
      iVar2 = Vec_IntSize(vInners_00);
      Vec_IntGrow(p_01,iVar1 + iVar2 + 0x14);
      Vec_IntPush(p_01,local_54);
      iVar1 = Vec_IntSize(vLeaves_00);
      Vec_IntPush(p_01,iVar1);
      iVar1 = Vec_IntSize(vInners_00);
      Vec_IntPush(p_01,iVar1);
      Vec_IntAppend(p_01,vLeaves_00);
      iVar1 = Vec_IntSize(vInners_00);
      iVar2 = Vec_IntSize(vLeaves_00);
      Vec_IntPush(p_01,(iVar1 * 1000) / iVar2);
    }
    local_54 = local_54 + 1;
  }
  Vec_IntFree(pVVar3);
  Vec_IntFree(vLeaves_00);
  Vec_IntFree(vInners_00);
  Vec_WecSortByLastInt(p_00,1);
  for (local_54 = 0; iVar1 = Vec_WecSize(p_00), local_54 < iVar1; local_54 = local_54 + 1) {
    pVVar3 = Vec_WecEntry(p_00,local_54);
    Vec_IntPop(pVVar3);
  }
  iVar1 = Vec_WecSize(p_00);
  iVar1 = (RatioBest * iVar1) / 100;
  for (local_54 = iVar1; iVar2 = Vec_WecSize(p_00), local_54 < iVar2; local_54 = local_54 + 1) {
    pVVar3 = Vec_WecEntry(p_00,local_54);
    Vec_IntErase(pVVar3);
  }
  iVar2 = Vec_WecSize(p_00);
  if (iVar1 <= iVar2) {
    Vec_WecShrink(p_00,iVar1);
    return p_00;
  }
  __assert_fail("iPivot <= Vec_WecSize(vMffcs)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaResub.c"
                ,0x8e,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Vec_Wec_t * Gia_ManComputeMffcs( Gia_Man_t * p, int LimitMin, int LimitMax, int SuppMax, int RatioBest )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vMffcs;
    Vec_Int_t * vNodes, * vLeaves, * vInners, * vMffc;
    int i, iPivot;
    assert( p->pMuxes );
    vNodes  = Vec_IntAlloc( 2 * LimitMax );
    vLeaves = Vec_IntAlloc( 2 * LimitMax );
    vInners = Vec_IntAlloc( 2 * LimitMax );
    vMffcs  = Vec_WecAlloc( 1000 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNum(p, pObj) )
            continue;
        if ( !Gia_ObjCheckMffc(p, pObj, LimitMax, vNodes, vLeaves, vInners) )
            continue;
        if ( Vec_IntSize(vInners) < LimitMin )
            continue;
        if ( Vec_IntSize(vLeaves) > SuppMax )
            continue;
        // improve cut
        // collect cut
        vMffc = Vec_WecPushLevel( vMffcs );
        Vec_IntGrow( vMffc, Vec_IntSize(vLeaves) + Vec_IntSize(vInners) + 20 );
        Vec_IntPush( vMffc, i );
        Vec_IntPush( vMffc, Vec_IntSize(vLeaves) );
        Vec_IntPush( vMffc, Vec_IntSize(vInners) );
        Vec_IntAppend( vMffc, vLeaves );
//        Vec_IntAppend( vMffc, vInners );
        // add last entry equal to the ratio
        Vec_IntPush( vMffc, 1000 * Vec_IntSize(vInners) / Vec_IntSize(vLeaves) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vInners );
    // sort MFFCs by their inner/leaf ratio
    Vec_WecSortByLastInt( vMffcs, 1 );
    Vec_WecForEachLevel( vMffcs, vMffc, i )
        Vec_IntPop( vMffc );
    // remove those whose ratio is not good
    iPivot = RatioBest * Vec_WecSize(vMffcs) / 100;
    Vec_WecForEachLevelStart( vMffcs, vMffc, i, iPivot )
        Vec_IntErase( vMffc );
    assert( iPivot <= Vec_WecSize(vMffcs) );
    Vec_WecShrink( vMffcs, iPivot );
    return vMffcs;
}